

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Transpose
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint in_stack_00000010;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inY;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inX;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *image;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  uchar *local_70;
  uchar *local_68;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff78,
             (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff70);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,(uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff78,
             (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff70);
  image = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(in_RDI,in_stack_ffffffffffffff58);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,in_stack_ffffffffffffff58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x133386);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  local_68 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  local_68 = local_68 + (ulong)in_ESI + (ulong)(in_EDX * uVar1);
  local_70 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  local_70 = local_70 + (ulong)in_R8D + (ulong)(in_R9D * uVar2);
  puVar3 = local_70 + in_stack_00000008 * uVar2;
  for (; local_70 != puVar3; local_70 = local_70 + uVar2) {
    puVar5 = local_68;
    for (puVar4 = local_70; puVar4 != local_70 + in_stack_00000010; puVar4 = puVar4 + 1) {
      *puVar4 = *puVar5;
      puVar5 = puVar5 + uVar1;
    }
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void Transpose( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );
        ParameterValidation( out, startXOut, startYOut, height, width );
        VerifyGrayScaleImage( in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inX  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + width * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, ++inX ) {
            const uint8_t * inY  = inX;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + height;

            for( ; outX != outXEnd; ++outX, inY += rowSizeIn )
                (*outX) = *(inY);
        }
    }